

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O3

string * __thiscall
slang::CommandLine::Option::set_abi_cxx11_
          (string *__return_storage_ptr__,Option *this,vector<int,_std::allocator<int>_> *target,
          string_view name,string_view value)

{
  iterator __position;
  _Optional_base<int,_true,_true> local_20;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_20._M_payload.super__Optional_payload_base<int> =
       (_Optional_payload<int,_true,_true,_true>)parseInt<int>(name,value,__return_storage_ptr__);
  if (((ulong)local_20._M_payload.super__Optional_payload_base<int> >> 0x20 & 1) != 0) {
    __position._M_current = *(int **)(target + 8);
    if (__position._M_current == *(int **)(target + 0x10)) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)target,__position,(int *)&local_20);
    }
    else {
      *__position._M_current = local_20._M_payload.super__Optional_payload_base<int>._M_payload;
      *(int **)(target + 8) = __position._M_current + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CommandLine::Option::set(std::vector<int32_t>& target, string_view name,
                                     string_view value) {
    std::string error;
    auto result = parseInt<int32_t>(name, value, error);
    if (result)
        target.push_back(*result);
    return error;
}